

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O1

void test_qclab_dense_kron<std::complex<float>>(void)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  bool bVar8;
  internal iVar9;
  pointer *__ptr_3;
  pointer *__ptr_5;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 (*pauVar11) [16];
  float *pfVar12;
  long lVar13;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  undefined1 auVar14 [16];
  SquareMatrix<std::complex<float>_> A;
  SquareMatrix<std::complex<float>_> B;
  SquareMatrix<std::complex<float>_> BoA;
  SquareMatrix<std::complex<float>_> AoB;
  SquareMatrix<std::complex<float>_> XoI;
  AssertionResult gtest_ar__3;
  SquareMatrix<std::complex<float>_> IoX;
  SquareMatrix<std::complex<float>_> X;
  SquareMatrix<std::complex<float>_> I;
  AssertHelper local_118;
  undefined1 local_110 [8];
  _Head_base<0UL,_std::complex<float>_*,_false> local_108;
  SquareMatrix<std::complex<float>_> local_100;
  string local_f0;
  internal local_d0;
  undefined7 uStack_cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  AssertHelper local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  internal local_b0;
  undefined7 uStack_af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  Message local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  AssertHelper local_90;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  SquareMatrix<std::complex<float>_> local_78;
  SquareMatrix<std::complex<float>_> local_68;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  local_68.size_ = 2;
  local_68.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined1 (*) [16])
   local_68.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)local_68.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) =
       (undefined1  [16])0x0;
  *(long *)local_68.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       SUB168(ZEXT416(0x3f800000),0);
  *(undefined1 (*) [16])
   ((long)local_68.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) =
       (undefined1  [16])0x0;
  *(long *)((long)local_68.data_._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) =
       SUB168(ZEXT416(0x3f800000),0);
  local_78.size_ = 2;
  local_78.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined1 (*) [16])
   ((long)local_78.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   local_78.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = (undefined1  [16])0x0;
  *(undefined8 *)
   local_78.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0;
  *(long *)((long)local_78.data_._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) =
       SUB168(ZEXT416(0x3f800000),0);
  *(long *)*(undefined1 (*) [16])
            ((long)local_78.data_._M_t.
                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) =
       SUB168(ZEXT416(0x3f800000),0);
  *(undefined8 *)
   ((long)local_78.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0;
  qclab::dense::kron<std::complex<float>>((dense *)&local_88,&local_68,&local_78);
  pauVar4 = (undefined1 (*) [16])operator_new__(0x80);
  *pauVar4 = (undefined1  [16])0x0;
  pauVar4[2] = (undefined1  [16])0x0;
  pauVar4[3] = (undefined1  [16])0x0;
  pauVar4[4] = (undefined1  [16])0x0;
  pauVar4[5] = (undefined1  [16])0x0;
  pauVar4[6] = (undefined1  [16])0x0;
  pauVar4[7] = (undefined1  [16])0x0;
  pauVar4[1] = (undefined1  [16])0x0;
  *(undefined8 *)(*pauVar4 + 8) = 0x3f800000;
  *(undefined8 *)pauVar4[2] = 0x3f800000;
  *(undefined1 (*) [16])(pauVar4[2] + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pauVar4[3] + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pauVar4[4] + 8) = (undefined1  [16])0x0;
  *(undefined4 *)(pauVar4[5] + 8) = 0x3f800000;
  *(undefined1 (*) [16])(pauVar4[5] + 0xc) = (undefined1  [16])0x0;
  *(undefined4 *)(pauVar4[6] + 0xc) = 0;
  auVar14._0_12_ = ZEXT812(0x3f800000);
  auVar14._12_4_ = 0;
  pauVar4[7] = auVar14;
  if (local_88 == 4) {
    local_b0 = (internal)0x0;
    if ((*(float *)*pauVar4 == *(float *)&(local_80->_M_dataplus)._M_p) &&
       (local_b0 = (internal)0x0,
       !NAN(*(float *)*pauVar4) && !NAN(*(float *)&(local_80->_M_dataplus)._M_p))) {
      pfVar5 = (float *)((long)&(local_80->_M_dataplus)._M_p + 4);
      local_b0 = (internal)0x0;
      if ((*(float *)(*pauVar4 + 4) == *pfVar5) && (!NAN(*(float *)(*pauVar4 + 4)) && !NAN(*pfVar5))
         ) {
        lVar10 = 0;
        local_b0 = (internal)0x0;
        in_R9 = local_80;
        pauVar11 = pauVar4;
        do {
          lVar13 = 0;
          while( true ) {
            if (lVar13 == 3) goto LAB_00198dc9;
            lVar1 = lVar13 + 1;
            if ((*(float *)(*pauVar11 + lVar13 * 8 + 8) !=
                 *(float *)(&in_R9->_M_string_length + lVar13)) ||
               (NAN(*(float *)(*pauVar11 + lVar13 * 8 + 8)) ||
                NAN(*(float *)(&in_R9->_M_string_length + lVar13)))) break;
            lVar2 = lVar13 * 8;
            pfVar5 = (float *)((long)&in_R9->_M_string_length + lVar13 * 8 + 4);
            if ((*(float *)(*pauVar11 + lVar2 + 0xc) != *pfVar5) ||
               (lVar13 = lVar1, NAN(*(float *)(*pauVar11 + lVar2 + 0xc)) || NAN(*pfVar5))) break;
          }
          if (lVar1 < 4) break;
LAB_00198dc9:
          lVar10 = lVar10 + 1;
          local_b0 = (internal)(3 < lVar10);
          if (lVar10 == 4) break;
          if ((*(float *)pauVar4[lVar10 * 2] != *(float *)&local_80[lVar10]._M_dataplus._M_p) ||
             (NAN(*(float *)pauVar4[lVar10 * 2]) ||
              NAN(*(float *)&local_80[lVar10]._M_dataplus._M_p))) break;
          pauVar11 = pauVar11 + 2;
          in_R9 = in_R9 + 1;
          pfVar5 = (float *)((long)&local_80[lVar10]._M_dataplus._M_p + 4);
          if ((*(float *)(pauVar4[lVar10 * 2] + 4) != *pfVar5) ||
             (NAN(*(float *)(pauVar4[lVar10 * 2] + 4)) || NAN(*pfVar5))) break;
        } while( true );
      }
    }
  }
  else {
    local_b0 = (internal)0x0;
  }
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_b0 == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,&local_b0,(AssertionResult *)"IoX == IoX_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x14,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  qclab::dense::kron<std::complex<float>>((dense *)&local_b0,&local_78,&local_68);
  pfVar5 = (float *)operator_new__(0x80);
  pfVar5[4] = 0.0;
  pfVar5[5] = 0.0;
  pfVar5[6] = 0.0;
  pfVar5[7] = 0.0;
  pfVar5[8] = 0.0;
  pfVar5[9] = 0.0;
  pfVar5[10] = 0.0;
  pfVar5[0xb] = 0.0;
  pfVar5[0xc] = 0.0;
  pfVar5[0xd] = 0.0;
  pfVar5[0xe] = 0.0;
  pfVar5[0xf] = 0.0;
  pfVar5[0x10] = 0.0;
  pfVar5[0x11] = 0.0;
  pfVar5[0x12] = 0.0;
  pfVar5[0x13] = 0.0;
  pfVar5[0x14] = 0.0;
  pfVar5[0x15] = 0.0;
  pfVar5[0x16] = 0.0;
  pfVar5[0x17] = 0.0;
  pfVar5[0x18] = 0.0;
  pfVar5[0x19] = 0.0;
  pfVar5[0x1a] = 0.0;
  pfVar5[0x1b] = 0.0;
  pfVar5[0x1c] = 0.0;
  pfVar5[0x1d] = 0.0;
  pfVar5[0x1e] = 0.0;
  pfVar5[0x1f] = 0.0;
  pfVar5[0] = 0.0;
  pfVar5[1] = 0.0;
  pfVar5[2] = 0.0;
  pfVar5[3] = 0.0;
  pfVar5[4] = 1.0;
  pfVar5[5] = 0.0;
  pfVar5[6] = 0.0;
  pfVar5[7] = 0.0;
  pfVar5[8] = 0.0;
  pfVar5[9] = 0.0;
  pfVar5[10] = 0.0;
  pfVar5[0xb] = 0.0;
  pfVar5[0xc] = 0.0;
  pfVar5[0xd] = 0.0;
  pfVar5[0xe] = 1.0;
  pfVar5[0xf] = 0.0;
  pfVar5[0x10] = 1.0;
  pfVar5[0x11] = 0.0;
  pfVar5[0x12] = 0.0;
  pfVar5[0x13] = 0.0;
  pfVar5[0x14] = 0.0;
  pfVar5[0x15] = 0.0;
  pfVar5[0x16] = 0.0;
  pfVar5[0x17] = 0.0;
  pfVar5[0x18] = 0.0;
  pfVar5[0x19] = 0.0;
  pfVar5[0x1a] = 1.0;
  pfVar5[0x1b] = 0.0;
  pfVar5[0x1c] = 0.0;
  pfVar5[0x1d] = 0.0;
  pfVar5[0x1e] = 0.0;
  pfVar5[0x1f] = 0.0;
  if (CONCAT71(uStack_af,local_b0) == 4) {
    bVar8 = false;
    if ((*pfVar5 == *(float *)&(local_a8->_M_dataplus)._M_p) &&
       (bVar8 = false, !NAN(*pfVar5) && !NAN(*(float *)&(local_a8->_M_dataplus)._M_p))) {
      pfVar6 = (float *)((long)&(local_a8->_M_dataplus)._M_p + 4);
      bVar8 = false;
      if ((pfVar5[1] == *pfVar6) && (!NAN(pfVar5[1]) && !NAN(*pfVar6))) {
        lVar10 = 0;
        bVar8 = false;
        in_R9 = local_a8;
        pfVar6 = pfVar5;
        do {
          lVar13 = 0;
          while( true ) {
            if (lVar13 == 3) goto LAB_00198fda;
            lVar1 = lVar13 + 1;
            if ((pfVar6[lVar13 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar13)) ||
               (NAN(pfVar6[lVar13 * 2 + 2]) || NAN(*(float *)(&in_R9->_M_string_length + lVar13))))
            break;
            lVar2 = lVar13 * 2;
            pfVar7 = (float *)((long)&in_R9->_M_string_length + lVar13 * 8 + 4);
            if ((pfVar6[lVar2 + 3] != *pfVar7) ||
               (lVar13 = lVar1, NAN(pfVar6[lVar2 + 3]) || NAN(*pfVar7))) break;
          }
          if (lVar1 < 4) break;
LAB_00198fda:
          lVar10 = lVar10 + 1;
          bVar8 = 3 < lVar10;
          if (lVar10 == 4) break;
          if ((pfVar5[lVar10 * 8] != *(float *)&local_a8[lVar10]._M_dataplus._M_p) ||
             (NAN(pfVar5[lVar10 * 8]) || NAN(*(float *)&local_a8[lVar10]._M_dataplus._M_p))) break;
          pfVar6 = pfVar6 + 8;
          in_R9 = in_R9 + 1;
          pfVar7 = (float *)((long)&local_a8[lVar10]._M_dataplus._M_p + 4);
          if ((pfVar5[lVar10 * 8 + 1] != *pfVar7) || (NAN(pfVar5[lVar10 * 8 + 1]) || NAN(*pfVar7)))
          break;
        } while( true );
      }
    }
  }
  else {
    bVar8 = false;
  }
  local_110[0] = bVar8;
  local_108._M_head_impl = (complex<float> *)0x0;
  if (bVar8 == false) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_110,(AssertionResult *)"XoI == XoI_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x1c,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_100.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_100.size_ + 8))();
    }
  }
  if (local_108._M_head_impl != (complex<float> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_108._M_head_impl);
  }
  local_110 = (undefined1  [8])0x2;
  local_108._M_head_impl = (complex<float> *)operator_new__(0x20);
  *(undefined8 *)((long)local_108._M_head_impl + 0x10) = 0;
  *(undefined8 *)((long)local_108._M_head_impl + 0x18) = 0;
  *local_108._M_head_impl = 0;
  *(undefined8 *)((long)local_108._M_head_impl + 8) = 0;
  *local_108._M_head_impl = 0x3f800000;
  *(undefined1 **)((long)local_108._M_head_impl + 8) = &DAT_40400000;
  *(undefined8 *)((long)local_108._M_head_impl + 0x10) = 0x40000000;
  *(undefined1 **)((long)local_108._M_head_impl + 0x18) = &DAT_40a00000;
  local_100.size_ = 2;
  local_100.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined8 *)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   local_100.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = 0;
  local_48 = &DAT_40e00000;
  puStack_40 = &DAT_41500000;
  *(undefined1 **)
   local_100.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = &DAT_40e00000;
  *(undefined1 **)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = &DAT_41500000;
  local_58 = &DAT_41300000;
  uStack_50 = 0x41880000;
  *(undefined1 **)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = &DAT_41300000;
  *(undefined8 *)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0x41880000;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_c0,(SquareMatrix<std::complex<float>_> *)local_110,&local_100);
  pfVar6 = (float *)operator_new__(0x80);
  *(undefined1 **)pfVar6 = local_48;
  *(undefined1 **)(pfVar6 + 2) = puStack_40;
  pfVar6[4] = 21.0;
  pfVar6[5] = 0.0;
  pfVar6[6] = 39.0;
  pfVar6[7] = 0.0;
  *(undefined1 **)(pfVar6 + 8) = local_58;
  *(undefined8 *)(pfVar6 + 10) = uStack_50;
  pfVar6[0xc] = 33.0;
  pfVar6[0xd] = 0.0;
  pfVar6[0xe] = 51.0;
  pfVar6[0xf] = 0.0;
  *(undefined1 **)(pfVar6 + 0x10) = &DAT_41600000;
  pfVar6[0x12] = 26.0;
  pfVar6[0x13] = 0.0;
  pfVar6[0x14] = 35.0;
  pfVar6[0x15] = 0.0;
  pfVar6[0x16] = 65.0;
  pfVar6[0x17] = 0.0;
  pfVar6[0x18] = 22.0;
  pfVar6[0x19] = 0.0;
  pfVar6[0x1a] = 34.0;
  pfVar6[0x1b] = 0.0;
  pfVar6[0x1c] = 55.0;
  pfVar6[0x1d] = 0.0;
  pfVar6[0x1e] = 85.0;
  pfVar6[0x1f] = 0.0;
  if (local_c0.data_ == (AssertHelperData *)&DAT_00000004) {
    local_d0 = (internal)0x0;
    if ((*pfVar6 == *(float *)&(local_b8->_M_dataplus)._M_p) &&
       (local_d0 = (internal)0x0, !NAN(*pfVar6) && !NAN(*(float *)&(local_b8->_M_dataplus)._M_p))) {
      pfVar7 = (float *)((long)&(local_b8->_M_dataplus)._M_p + 4);
      local_d0 = (internal)0x0;
      if ((pfVar6[1] == *pfVar7) && (!NAN(pfVar6[1]) && !NAN(*pfVar7))) {
        lVar10 = 0;
        local_d0 = (internal)0x0;
        in_R9 = local_b8;
        pfVar7 = pfVar6;
        do {
          lVar13 = 0;
          while( true ) {
            if (lVar13 == 3) goto LAB_001992a7;
            lVar1 = lVar13 + 1;
            if ((pfVar7[lVar13 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar13)) ||
               (NAN(pfVar7[lVar13 * 2 + 2]) || NAN(*(float *)(&in_R9->_M_string_length + lVar13))))
            break;
            lVar2 = lVar13 * 2;
            pfVar12 = (float *)((long)&in_R9->_M_string_length + lVar13 * 8 + 4);
            if ((pfVar7[lVar2 + 3] != *pfVar12) ||
               (lVar13 = lVar1, NAN(pfVar7[lVar2 + 3]) || NAN(*pfVar12))) break;
          }
          if (lVar1 < 4) break;
LAB_001992a7:
          lVar10 = lVar10 + 1;
          local_d0 = (internal)(3 < lVar10);
          if (lVar10 == 4) break;
          if ((pfVar6[lVar10 * 8] != *(float *)&local_b8[lVar10]._M_dataplus._M_p) ||
             (NAN(pfVar6[lVar10 * 8]) || NAN(*(float *)&local_b8[lVar10]._M_dataplus._M_p))) break;
          pfVar7 = pfVar7 + 8;
          in_R9 = in_R9 + 1;
          pfVar12 = (float *)((long)&local_b8[lVar10]._M_dataplus._M_p + 4);
          if ((pfVar6[lVar10 * 8 + 1] != *pfVar12) || (NAN(pfVar6[lVar10 * 8 + 1]) || NAN(*pfVar12))
             ) break;
        } while( true );
      }
    }
  }
  else {
    local_d0 = (internal)0x0;
  }
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_d0 == (internal)0x0) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,&local_d0,(AssertionResult *)"AoB == AoB_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x2b,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_118,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_d0,&local_100,(SquareMatrix<std::complex<float>_> *)local_110);
  pfVar7 = (float *)operator_new__(0x80);
  *(undefined1 **)pfVar7 = &DAT_40e00000;
  pfVar7[2] = 21.0;
  pfVar7[3] = 0.0;
  *(undefined1 **)(pfVar7 + 4) = &DAT_41500000;
  pfVar7[6] = 39.0;
  pfVar7[7] = 0.0;
  *(undefined1 **)(pfVar7 + 8) = &DAT_41600000;
  pfVar7[10] = 35.0;
  pfVar7[0xb] = 0.0;
  pfVar7[0xc] = 26.0;
  pfVar7[0xd] = 0.0;
  pfVar7[0xe] = 65.0;
  pfVar7[0xf] = 0.0;
  *(undefined1 **)(pfVar7 + 0x10) = &DAT_41300000;
  pfVar7[0x12] = 33.0;
  pfVar7[0x13] = 0.0;
  pfVar7[0x14] = 17.0;
  pfVar7[0x15] = 0.0;
  pfVar7[0x16] = 51.0;
  pfVar7[0x17] = 0.0;
  pfVar7[0x18] = 22.0;
  pfVar7[0x19] = 0.0;
  pfVar7[0x1a] = 55.0;
  pfVar7[0x1b] = 0.0;
  pfVar7[0x1c] = 34.0;
  pfVar7[0x1d] = 0.0;
  pfVar7[0x1e] = 85.0;
  pfVar7[0x1f] = 0.0;
  if (CONCAT71(uStack_cf,local_d0) == 4) {
    iVar9 = (internal)0x0;
    local_a0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)0x0;
    if ((*pfVar7 == *(float *)&(local_c8->_M_dataplus)._M_p) &&
       (local_a0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = iVar9, !NAN(*pfVar7) && !NAN(*(float *)&(local_c8->_M_dataplus)._M_p))
       ) {
      pfVar12 = (float *)((long)&(local_c8->_M_dataplus)._M_p + 4);
      if ((pfVar7[1] == *pfVar12) && (!NAN(pfVar7[1]) && !NAN(*pfVar12))) {
        lVar10 = 0;
        local_a0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)0x0;
        in_R9 = local_c8;
        pfVar12 = pfVar7;
        do {
          lVar13 = 0;
          while( true ) {
            if (lVar13 == 3) goto LAB_001994d9;
            lVar1 = lVar13 + 1;
            if ((pfVar12[lVar13 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar13)) ||
               (NAN(pfVar12[lVar13 * 2 + 2]) || NAN(*(float *)(&in_R9->_M_string_length + lVar13))))
            break;
            lVar2 = lVar13 * 2;
            pfVar3 = (float *)((long)&in_R9->_M_string_length + lVar13 * 8 + 4);
            if ((pfVar12[lVar2 + 3] != *pfVar3) ||
               (lVar13 = lVar1, NAN(pfVar12[lVar2 + 3]) || NAN(*pfVar3))) break;
          }
          if (lVar1 < 4) break;
LAB_001994d9:
          lVar10 = lVar10 + 1;
          local_a0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(3 < lVar10);
          if (lVar10 == 4) break;
          if ((pfVar7[lVar10 * 8] != *(float *)&local_c8[lVar10]._M_dataplus._M_p) ||
             (NAN(pfVar7[lVar10 * 8]) || NAN(*(float *)&local_c8[lVar10]._M_dataplus._M_p))) break;
          pfVar12 = pfVar12 + 8;
          in_R9 = in_R9 + 1;
          pfVar3 = (float *)((long)&local_c8[lVar10]._M_dataplus._M_p + 4);
          if ((pfVar7[lVar10 * 8 + 1] != *pfVar3) || (NAN(pfVar7[lVar10 * 8 + 1]) || NAN(*pfVar3)))
          break;
        } while( true );
      }
    }
  }
  else {
    local_a0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)0x0;
  }
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a0.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_a0,(AssertionResult *)"BoA == BoA_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x33,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  operator_delete__(pfVar7);
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_c8);
  }
  operator_delete__(pfVar6);
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_b8);
  }
  if (local_100.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_100.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
      local_108._M_head_impl != (complex<float> *)0x0) {
    operator_delete__(local_108._M_head_impl);
  }
  operator_delete__(pfVar5);
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a8);
  }
  operator_delete__(pauVar4);
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_80);
  }
  if (local_78.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_78.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
      local_68.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl != (complex<float> *)0x0) {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}